

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_scan.cpp
# Opt level: O2

void __thiscall duckdb::DuckIndexScanState::~DuckIndexScanState(DuckIndexScanState *this)

{
  (this->super_TableScanGlobalState).super_GlobalTableFunctionState._vptr_GlobalTableFunctionState =
       (_func_int **)&PTR__DuckIndexScanState_017926e0;
  ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::~vector
            (&(this->column_ids).
              super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>);
  ::std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            ((_Vector_base<long,_std::allocator<long>_> *)&this->row_ids);
  TableScanGlobalState::~TableScanGlobalState(&this->super_TableScanGlobalState);
  return;
}

Assistant:

DuckIndexScanState(ClientContext &context, const FunctionData *bind_data_p)
	    : TableScanGlobalState(context, bind_data_p), next_batch_index(0), finished(false) {
	}